

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_discard_flow.cpp
# Opt level: O2

ir_visitor_status __thiscall
anon_unknown.dwarf_508ee::lower_discard_flow_visitor::visit_enter
          (lower_discard_flow_visitor *this,ir_function_signature *ir)

{
  exec_node *peVar1;
  exec_node *peVar2;
  int iVar3;
  ir_dereference_variable *this_00;
  ir_constant *this_01;
  ir_assignment *this_02;
  
  iVar3 = strcmp(ir->_function->name,"main");
  if (iVar3 == 0) {
    this_00 = (ir_dereference_variable *)exec_node::operator_new(0x30,this->mem_ctx);
    ir_dereference_variable::ir_dereference_variable(this_00,this->discarded);
    this_01 = (ir_constant *)exec_node::operator_new(0xb0,this->mem_ctx);
    ir_constant::ir_constant(this_01,false,1);
    this_02 = (ir_assignment *)exec_node::operator_new(0x40,this->mem_ctx);
    ir_assignment::ir_assignment(this_02,(ir_rvalue *)this_00,(ir_rvalue *)this_01,(ir_rvalue *)0x0)
    ;
    peVar1 = &(this_02->super_ir_instruction).super_exec_node;
    peVar2 = (ir->body).head_sentinel.next;
    (this_02->super_ir_instruction).super_exec_node.next = peVar2;
    (this_02->super_ir_instruction).super_exec_node.prev = &(ir->body).head_sentinel;
    peVar2->prev = peVar1;
    (ir->body).head_sentinel.next = peVar1;
  }
  return visit_continue;
}

Assistant:

ir_visitor_status
lower_discard_flow_visitor::visit_enter(ir_function_signature *ir)
{
   if (strcmp(ir->function_name(), "main") != 0)
      return visit_continue;

   ir_dereference *lhs = new(mem_ctx) ir_dereference_variable(discarded);
   ir_rvalue *rhs = new(mem_ctx) ir_constant(false);
   ir_assignment *assign = new(mem_ctx) ir_assignment(lhs, rhs);
   ir->body.push_head(assign);

   return visit_continue;
}